

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O2

int init_reg_rules_alloc(Dwarf_Debug dbg,Dwarf_Frame_s *f,Dwarf_Unsigned count,Dwarf_Error *error)

{
  Dwarf_Reg_Rule_s *base;
  Dwarf_Error *initial_value;
  int iVar1;
  
  f->fr_reg_count = count;
  initial_value = error;
  base = (Dwarf_Reg_Rule_s *)calloc(count,0x40);
  f->fr_reg = base;
  if (base == (Dwarf_Reg_Rule_s *)0x0) {
    iVar1 = 1;
    if (error != (Dwarf_Error *)0x0) {
      _dwarf_error(dbg,error,0xc0);
    }
  }
  else {
    _dwarf_init_reg_rules_ru
              (base,count,dbg->de_frame_rule_initial_value,(Dwarf_Unsigned)initial_value);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
init_reg_rules_alloc(Dwarf_Debug dbg,struct Dwarf_Frame_s *f,
    Dwarf_Unsigned count, Dwarf_Error * error)
{
    f->fr_reg_count = count;
    f->fr_reg = (struct Dwarf_Reg_Rule_s *)
        calloc((size_t)count, sizeof(struct Dwarf_Reg_Rule_s));
    if (f->fr_reg == 0) {
        if (error) {
            _dwarf_error(dbg, error, DW_DLE_DF_ALLOC_FAIL);
        }
        return DW_DLV_ERROR;
    }
    _dwarf_init_reg_rules_ru(f->fr_reg,0, count,
        dbg->de_frame_rule_initial_value);
    return DW_DLV_OK;
}